

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_javame_generator.cc
# Opt level: O1

void __thiscall
t_javame_generator::generate_java_struct_result_writer
          (t_javame_generator *this,ostream *out,t_struct *tstruct)

{
  int *piVar1;
  long lVar2;
  t_field *tfield;
  int iVar3;
  ostream *poVar4;
  undefined4 extraout_var;
  pointer pptVar5;
  t_javame_generator *this_00;
  bool bVar6;
  string name;
  string local_d8;
  t_struct *local_b8;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_b8 = tstruct;
  t_generator::indent_abi_cxx11_(&local_b0,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"public void write(TProtocol oprot) throws TException {",0x36);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + 1;
  iVar3 = (*(local_b8->super_t_type).super_t_doc._vptr_t_doc[3])();
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  lVar2 = *(long *)CONCAT44(extraout_var,iVar3);
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b0,lVar2,((long *)CONCAT44(extraout_var,iVar3))[1] + lVar2);
  poVar4 = t_generator::indent((t_generator *)this,out);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,"oprot.writeStructBegin(STRUCT_DESC);",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  pptVar5 = (local_b8->members_in_id_order_).
            super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pptVar5 !=
      (local_b8->members_in_id_order_).super__Vector_base<t_field_*,_std::allocator<t_field_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    bVar6 = true;
    do {
      if (bVar6) {
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,::endl_abi_cxx11_._M_dataplus._M_p,
                            ::endl_abi_cxx11_._M_string_length);
        t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar4,local_d8._M_dataplus._M_p,local_d8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"if ",3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p);
        }
        bVar6 = false;
      }
      else {
        std::__ostream_insert<char,std::char_traits<char>>(out," else if ",9);
      }
      std::__ostream_insert<char,std::char_traits<char>>(out,"(this.",6);
      generate_isset_check_abi_cxx11_(&local_d8,this,*pptVar5);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (out,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,") {",3);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + 1;
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"oprot.writeFieldBegin(",0x16);
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      this_00 = (t_javame_generator *)((*pptVar5)->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,this_00,
                 (pointer)((long)&(this_00->super_t_oop_generator).super_t_generator.
                                  _vptr_t_generator + ((*pptVar5)->name_)._M_string_length));
      constant_name(&local_d8,this_00,&local_70);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar4,local_d8._M_dataplus._M_p,local_d8._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"_FIELD_DESC);",0xd);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
        operator_delete(local_d8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      tfield = *pptVar5;
      local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"this.","");
      generate_serialize_field(this,out,tfield,&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p);
      }
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"oprot.writeFieldEnd();",0x16);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
      piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
      *piVar1 = *piVar1 + -1;
      poVar4 = t_generator::indent((t_generator *)this,out);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
      pptVar5 = pptVar5 + 1;
    } while (pptVar5 !=
             (local_b8->members_in_id_order_).
             super__Vector_base<t_field_*,_std::allocator<t_field_*>_>._M_impl.
             super__Vector_impl_data._M_finish);
  }
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"oprot.writeFieldStop();",0x17);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"oprot.writeStructEnd();",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  piVar1 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_d8,(t_generator *)this);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (out,local_d8._M_dataplus._M_p,local_d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"}",1);
  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar4,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return;
}

Assistant:

void t_javame_generator::generate_java_struct_result_writer(ostream& out, t_struct* tstruct) {
  out << indent() << "public void write(TProtocol oprot) throws TException {" << endl;
  indent_up();

  string name = tstruct->get_name();
  const vector<t_field*>& fields = tstruct->get_sorted_members();
  vector<t_field*>::const_iterator f_iter;

  indent(out) << "oprot.writeStructBegin(STRUCT_DESC);" << endl;

  bool first = true;
  for (f_iter = fields.begin(); f_iter != fields.end(); ++f_iter) {
    if (first) {
      first = false;
      out << endl << indent() << "if ";
    } else {
      out << " else if ";
    }

    out << "(this." << generate_isset_check(*f_iter) << ") {" << endl;

    indent_up();

    indent(out) << "oprot.writeFieldBegin(" << constant_name((*f_iter)->get_name())
                << "_FIELD_DESC);" << endl;

    // Write field contents
    generate_serialize_field(out, *f_iter, "this.");

    // Write field closer
    indent(out) << "oprot.writeFieldEnd();" << endl;

    indent_down();
    indent(out) << "}";
  }
  // Write the struct map
  out << endl << indent() << "oprot.writeFieldStop();" << endl << indent()
      << "oprot.writeStructEnd();" << endl;

  indent_down();
  out << indent() << "}" << endl << endl;
}